

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O0

void __thiscall
SudokuChain::print(SudokuChain *this,PrintTarget target,string *filename,PrintMode mode)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  char *pcVar5;
  ostream *poVar6;
  element_type *peVar7;
  __shared_ptr_access<ChainedSudoku,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  ostream local_490 [8];
  ofstream file_1;
  string local_290 [32];
  __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_270;
  shared_ptr<SudokuChain::SudokuSpecification> *specification;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
  *__range1;
  int local_248;
  int offset_y;
  int offset_x;
  double height;
  double width;
  ofstream file;
  PrintMode mode_local;
  string *filename_local;
  PrintTarget target_local;
  SudokuChain *this_local;
  
  if (target == svg_file_body) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_out,_S_trunc);
    std::ofstream::ofstream((ostream *)&width,pcVar5,_Var4);
    iVar1 = this->nFieldsX_;
    iVar2 = this->nFieldsY_;
    poVar6 = std::operator<<((ostream *)&width,
                             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<svg width=\"");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)(iVar1 * 0x1e));
    poVar6 = std::operator<<(poVar6,"\" height=\"");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)(iVar2 * 0x1e));
    std::operator<<(poVar6,"\">\n<g>\n");
    std::ofstream::close();
    std::ofstream::~ofstream(&width);
  }
  local_248 = 0;
  __range1._4_4_ = -this->coordinateYbottom_;
  __end1 = std::
           vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           ::begin(&this->sudokuSpecifications_);
  specification =
       (shared_ptr<SudokuChain::SudokuSpecification> *)
       std::
       vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
       ::end(&this->sudokuSpecifications_);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<SudokuChain::SudokuSpecification>_*,_std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>_>
                                *)&specification);
    if (!bVar3) break;
    local_270 = (__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<SudokuChain::SudokuSpecification>_*,_std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>_>
                   ::operator*(&__end1);
    peVar7 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_270);
    local_248 = local_248 + peVar7->offset_from_previous_x;
    peVar7 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_270);
    __range1._4_4_ = __range1._4_4_ + peVar7->offset_from_previous_y;
    peVar7 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_270);
    this_00 = (__shared_ptr_access<ChainedSudoku,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<ChainedSudoku>,_std::allocator<std::shared_ptr<ChainedSudoku>_>_>
              ::operator[](&this->sudoku_,(long)peVar7->sudoku_no);
    this_01 = std::__shared_ptr_access<ChainedSudoku,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    std::__cxx11::string::string(local_290,(string *)filename);
    peVar7 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_270);
    ChainedSudoku::print
              (this_01,target,(string *)local_290,mode,local_248,__range1._4_4_,peVar7->sudoku_no);
    std::__cxx11::string::~string(local_290);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<SudokuChain::SudokuSpecification>_*,_std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>_>
    ::operator++(&__end1);
  }
  if (target == svg_file_body) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _Var4 = std::operator|(_S_out,_S_app);
    std::ofstream::ofstream(local_490,pcVar5,_Var4);
    std::operator<<(local_490,"\n</g>\n</svg>\n");
    std::ofstream::close();
    std::ofstream::~ofstream(local_490);
  }
  return;
}

Assistant:

void SudokuChain::print(ChainedSudoku::PrintTarget target, std::string filename, ChainedSudoku::PrintMode mode)
{
  if(target == ChainedSudoku::PrintTarget::svg_file_body)
  {
    // begin svg file
    std::ofstream file(filename.c_str(), std::ios::out | std::ios::trunc);
    double width = 30*nFieldsX_;
    double height = 30*nFieldsY_;
    file<<"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<svg width=\""<<width<<"\" height=\""<<height<<"\">\n<g>\n";
    file.close();
  }

  int offset_x = 0;
  int offset_y = -coordinateYbottom_;
  for(auto& specification : sudokuSpecifications_)
  {
    offset_x += specification->offset_from_previous_x;
    offset_y += specification->offset_from_previous_y;
    sudoku_[specification->sudoku_no]->print(target, filename, mode, offset_x, offset_y, specification->sudoku_no+number_offset);
  }

  if(target == ChainedSudoku::PrintTarget::svg_file_body)
  {
    // end svg file
    std::ofstream file(filename.c_str(), std::ios::out | std::ios::app);
    file<<"\n</g>\n</svg>\n";
    file.close();
  }
}